

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int fits_unencode_url(char *inpath,char *outpath,int *status)

{
  char *pcVar1;
  char cVar2;
  char *pcStack_38;
  char c;
  char *q;
  char *p;
  int *status_local;
  char *outpath_local;
  char *inpath_local;
  
  pcStack_38 = outpath;
  pcVar1 = inpath;
  if (*status == 0) {
    while (q = pcVar1, *q != '\0') {
      if (*q == '%') {
        cVar2 = q[1];
        pcVar1 = q + 1;
        if (cVar2 != '\0') {
          if ((cVar2 < '0') || ('9' < cVar2)) {
            if ((cVar2 < 'A') || ('F' < cVar2)) {
              cVar2 = cVar2 + -0x57;
            }
            else {
              cVar2 = cVar2 + -0x37;
            }
          }
          else {
            cVar2 = cVar2 + -0x30;
          }
          *pcStack_38 = cVar2 << 4;
          cVar2 = q[2];
          pcVar1 = q + 2;
          if (cVar2 != '\0') {
            if ((cVar2 < '0') || ('9' < cVar2)) {
              if ((cVar2 < 'A') || ('F' < cVar2)) {
                cVar2 = cVar2 + -0x57;
              }
              else {
                cVar2 = cVar2 + -0x37;
              }
            }
            else {
              cVar2 = cVar2 + -0x30;
            }
            *pcStack_38 = *pcStack_38 + cVar2;
            pcStack_38 = pcStack_38 + 1;
            pcVar1 = q + 3;
          }
        }
      }
      else {
        *pcStack_38 = *q;
        pcStack_38 = pcStack_38 + 1;
        pcVar1 = q + 1;
      }
    }
    *pcStack_38 = '\0';
    inpath_local._4_4_ = *status;
  }
  else {
    inpath_local._4_4_ = *status;
  }
  return inpath_local._4_4_;
}

Assistant:

int fits_unencode_url(char *inpath,  /* I input URL with encoding            */
		      char *outpath, /* O unencoded URL                      */
		      int  *status)
     /*
       unencode all URL "unsafe" and "reserved" characters to their actual
       ASCII representation. All tokens of the form "%XX" where XX is the
       hexidecimal code for an ASCII character, are searched for and
       translated into the actuall ASCII character (so three chars become
       1 char).

       It is assumed that OUTPATH has enough room to hold the unencoded
       URL.

       This function was adopted from code in the libwww.a library available
       via the W3 consortium <URL: http://www.w3.org>
     */

{
    char *p;
    char *q;
    char  c;

    if(*status != 0) return(*status);

    p = inpath;
    q = outpath;

    /* 
       loop over all characters in the inpath looking for the '%' escape
       character; if found the process the escape sequence
    */

    while(*p != 0) 
      {
	/* 
	   if the character is '%' then unencode the sequence, else
	   just copy the character from inpath to outpath
        */

        if (*p == HEX_ESCAPE)
	  {
            if((c = *(++p)) != 0)
	      { 
		*q = (
		      (c >= '0' && c <= '9') ?
		      (c - '0') : ((c >= 'A' && c <= 'F') ?
				   (c - 'A' + 10) : (c - 'a' + 10))
		      )*16;

		if((c = *(++p)) != 0)
		  {
		    *q = *q + (
			       (c >= '0' && c <= '9') ? 
		               (c - '0') : ((c >= 'A' && c <= 'F') ? 
					    (c - 'A' + 10) : (c - 'a' + 10))
			       );
		    p++, q++;
		  }
	      }
	  } 
	else
	  *q++ = *p++; 
      }
 
    /* terminate the outpath */
    *q = 0;

    return(*status);   
}